

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grad-check.cc
# Opt level: O0

bool cnn::CheckGrad(Model *m,ComputationGraph *g,int verbosity)

{
  bool bVar1;
  uint uVar2;
  reference ppPVar3;
  reference ppLVar4;
  void *pvVar5;
  reference puVar6;
  reference v_00;
  reference v_01;
  float *pfVar7;
  ostream *poVar8;
  int in_EDX;
  int index;
  Model *in_RDI;
  float value;
  real rVar9;
  double dVar10;
  float m_2;
  float f_1;
  float g_act_1;
  float g_2;
  float E_right_1;
  float E_left_1;
  float old_1;
  size_t i_1;
  Tensor *ag;
  Tensor *v;
  uint j;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  size_t ts_1;
  LookupParameters *p_1;
  LookupParameters *pp_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_3;
  float m_1;
  float f;
  float g_act;
  float g_1;
  float E_right;
  float E_left;
  float old;
  size_t i;
  size_t ts;
  Parameters *p;
  Parameters *pp_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1_2;
  bool curr_flag;
  bool flag;
  float alpha;
  LookupParameters *pp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_1;
  Parameters *pp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *lookup_params;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *params;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
  *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ulong local_138;
  _Node_iterator_base<unsigned_int,_false> local_118;
  _Node_iterator_base<unsigned_int,_false> local_110;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_108;
  ulong local_100;
  LookupParameters *local_f8;
  LookupParameters *local_f0;
  LookupParameters **local_e8;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_e0;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  real local_b0;
  float local_ac;
  ulong local_a8;
  ulong local_a0;
  Parameters *local_98;
  Parameters *local_90;
  Parameters **local_88;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_80;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *local_78;
  byte local_6e;
  byte local_6d;
  float local_6c;
  LookupParameters *local_68;
  LookupParameters **local_60;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_58;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_50;
  Parameters *local_48;
  Parameters **local_40;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_38;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *local_30;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_28;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *local_20;
  int local_14;
  Model *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = Model::parameters_list(in_RDI);
  local_28 = Model::lookup_parameters_list(local_8);
  local_30 = local_20;
  local_38._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  in_stack_fffffffffffffe98);
  local_40 = (Parameters **)
             std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                       ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                        in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppPVar3;
    Parameters::clear((Parameters *)0x515762);
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_38);
  }
  local_50 = local_28;
  local_58._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 (in_stack_fffffffffffffe98);
  local_60 = (LookupParameters **)
             std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                       (in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppLVar4 = __gnu_cxx::
              __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
              ::operator*(&local_58);
    local_68 = *ppLVar4;
    LookupParameters::clear
              ((LookupParameters *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_58);
  }
  local_6c = 0.0005;
  ComputationGraph::forward((ComputationGraph *)0x515818);
  ComputationGraph::backward((ComputationGraph *)0x515825);
  local_6d = 0;
  local_6e = 0;
  local_78 = local_20;
  local_80._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  in_stack_fffffffffffffe98);
  local_88 = (Parameters **)
             std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                       ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                        in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
              ::operator*(&local_80);
    local_90 = *ppPVar3;
    if (1 < local_14) {
      poVar8 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<(poVar8,"PARAMETERS ");
      pvVar5 = (void *)std::ostream::operator<<(poVar8,local_90);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_98 = local_90;
    uVar2 = Dim::size((Dim *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_a0 = (ulong)uVar2;
    for (local_a8 = 0; local_a8 < local_a0; local_a8 = local_a8 + 1) {
      local_ac = TensorTools::AccessElement(&local_98->values,(int)local_a8);
      TensorTools::SetElement(&local_98->values,(int)local_a8,local_ac - local_6c);
      ComputationGraph::forward((ComputationGraph *)0x51599b);
      local_b0 = as_scalar((Tensor *)0x5159a3);
      TensorTools::SetElement(&local_98->values,(int)local_a8,local_ac + local_6c);
      ComputationGraph::forward((ComputationGraph *)0x5159e6);
      local_b4 = as_scalar((Tensor *)0x5159ee);
      TensorTools::SetElement(&local_98->values,(int)local_a8,local_ac);
      local_b8 = (local_b4 - local_b0) / (local_6c * 2.0);
      local_bc = TensorTools::AccessElement(&local_98->g,(int)local_a8);
      dVar10 = std::fabs((double)(ulong)(uint)(local_b8 - local_bc));
      local_c0 = SUB84(dVar10,0);
      dVar10 = std::fabs((double)(ulong)(uint)local_b8);
      local_c8 = SUB84(dVar10,0);
      dVar10 = std::fabs((double)(ulong)(uint)local_bc);
      local_cc = SUB84(dVar10,0);
      pfVar7 = std::max<float>(&local_c8,&local_cc);
      local_c4 = *pfVar7;
      if ((0.1 < local_c0) && (0.0 < local_c4)) {
        local_c0 = local_c0 / local_c4;
      }
      if (((0.1 < local_c0) || (uVar2 = std::isnan((double)(ulong)(uint)local_c0), (uVar2 & 1) != 0)
          ) && (local_6d = 1, 0 < local_14)) {
        local_6e = 1;
        poVar8 = std::operator<<((ostream *)&std::cerr,"***[");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_c0);
        std::operator<<(poVar8,"] ");
      }
      if (1 < (int)(local_14 + (uint)((local_6e & 1) != 0))) {
        poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,local_bc);
        poVar8 = std::operator<<(poVar8,' ');
        pvVar5 = (void *)std::ostream::operator<<(poVar8,local_b8);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        local_6e = 0;
      }
    }
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_80);
  }
  local_d8 = local_28;
  local_e0._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 (in_stack_fffffffffffffe98);
  local_e8 = (LookupParameters **)
             std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                       (in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppLVar4 = __gnu_cxx::
              __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
              ::operator*(&local_e0);
    local_f0 = *ppLVar4;
    if (1 < local_14) {
      poVar8 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<(poVar8,"LOOKUP PARAMETERS ");
      pvVar5 = (void *)std::ostream::operator<<(poVar8,local_f0);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_f8 = local_f0;
    uVar2 = Dim::size((Dim *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_100 = (ulong)uVar2;
    local_108 = &local_f8->non_zero_grads;
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)in_stack_fffffffffffffe98);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_fffffffffffffe98);
    while (bVar1 = std::__detail::operator!=(&local_110,&local_118), bVar1) {
      puVar6 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x515d69);
      uVar2 = *puVar6;
      if (1 < local_14) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"OBJECT=");
        pvVar5 = (void *)std::ostream::operator<<(poVar8,uVar2);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      v_00 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       (&local_f8->values,(ulong)uVar2);
      v_01 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       (&local_f8->grads,(ulong)uVar2);
      for (local_138 = 0; local_138 < local_100; local_138 = local_138 + 1) {
        index = (int)local_138;
        value = TensorTools::AccessElement(v_00,index);
        TensorTools::SetElement(v_00,index,value - local_6c);
        ComputationGraph::forward((ComputationGraph *)0x515e36);
        rVar9 = as_scalar((Tensor *)0x515e3e);
        TensorTools::SetElement(v_00,index,value + local_6c);
        ComputationGraph::forward((ComputationGraph *)0x515e71);
        local_144 = as_scalar((Tensor *)0x515e79);
        TensorTools::SetElement(v_00,index,value);
        local_148 = (local_144 - rVar9) / (local_6c * 2.0);
        local_14c = TensorTools::AccessElement(v_01,index);
        dVar10 = std::fabs((double)(ulong)(uint)(local_148 - local_14c));
        local_150 = SUB84(dVar10,0);
        dVar10 = std::fabs((double)(ulong)(uint)local_148);
        local_158 = SUB84(dVar10,0);
        dVar10 = std::fabs((double)(ulong)(uint)local_14c);
        in_stack_fffffffffffffea4 = SUB84(dVar10,0);
        pfVar7 = std::max<float>(&local_158,(float *)&stack0xfffffffffffffea4);
        local_154 = *pfVar7;
        if ((0.1 < local_150) && (0.0 < local_154)) {
          local_150 = local_150 / local_154;
        }
        if (((0.1 < local_150) ||
            (uVar2 = std::isnan((double)(ulong)(uint)local_150), (uVar2 & 1) != 0)) &&
           (local_6d = 1, 0 < local_14)) {
          local_6e = 1;
          poVar8 = std::operator<<((ostream *)&std::cerr,"***[");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_150);
          std::operator<<(poVar8,"] ");
        }
        if (1 < (int)(local_14 + (uint)((local_6e & 1) != 0))) {
          poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,local_14c);
          poVar8 = std::operator<<(poVar8,' ');
          pvVar5 = (void *)std::ostream::operator<<(poVar8,local_148);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          local_6e = 0;
        }
      }
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                ((_Node_iterator<unsigned_int,_true,_false> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_e0);
  }
  if ((local_6d & 1) == 0) {
    if (0 < local_14) {
      poVar8 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<(poVar8,"GRADIENT CHECK PASSED");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (1 < local_14) {
    poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"*** GRADIENT CHECK FAILED ***");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  return (bool)((local_6d ^ 0xff) & 1);
}

Assistant:

bool CheckGrad(Model& m, ComputationGraph& g, int verbosity) {
  // Clear the parameters first
  const vector<Parameters*>& params = m.parameters_list();
  const vector<LookupParameters*>& lookup_params = m.lookup_parameters_list();
  for (auto pp : params)
    pp->clear();
  for (auto pp : lookup_params)
    pp->clear();

  // Perform forward and backward steps
  float alpha = 5e-4;
  g.forward();
  g.backward();

  // Check
  bool flag = false, curr_flag = false;
  for (auto pp : params) {
    if(verbosity > 1)
      cerr << endl << "PARAMETERS " << pp << endl;
    Parameters& p = *pp;
    size_t ts = p.dim.size();
    for (size_t i = 0; i < ts; ++i) {
      float old = TensorTools::AccessElement(p.values, i);
      TensorTools::SetElement(p.values, i, old - alpha);
      float E_left = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old + alpha);
      float E_right = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old);
      float g = (E_right - E_left) / (2 * alpha);
      float g_act = TensorTools::AccessElement(p.g, i);
      float f = fabs(g - g_act);
      float m = max(fabs(g), fabs(g_act));
      if (f > 0.1 && m > 0.f) f /= m;
      if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
      if(verbosity + (curr_flag ? 1 : 0) > 1) {
        cerr << g_act << ' ' << g << endl;
        curr_flag = false;
      }
    }
  }

  for (auto pp : lookup_params) {
    if(verbosity > 1)
      cerr << endl << "LOOKUP PARAMETERS " << pp << endl;
    LookupParameters& p = *pp;
    size_t ts = p.dim.size();
    for (unsigned j : p.non_zero_grads) {
      if(verbosity > 1)
        cerr << "OBJECT=" << j << endl;
      Tensor& v = p.values[j];
      Tensor& ag = p.grads[j];
      for (size_t i = 0; i < ts; ++i) {
        float old = TensorTools::AccessElement(v, i);
        TensorTools::SetElement(v, i, old - alpha);
        float E_left = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old + alpha);
        float E_right = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old);
        float g = (E_right - E_left) / (2 * alpha);
        float g_act = TensorTools::AccessElement(ag, i);
        float f = fabs(g - g_act);
        float m = max(fabs(g), fabs(g_act));
        if (f > 0.1 && m > 0.f) f /= m;
        if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
        if(verbosity + (curr_flag ? 1 : 0) > 1) {
          cerr << g_act << ' ' << g << endl;
          curr_flag = false;
        }
      }
    }
  }

  if (flag) {
    if (verbosity > 1)
      cerr << endl << "*** GRADIENT CHECK FAILED ***" << endl;
  } else {
    if (verbosity > 0)
      cerr << endl << "GRADIENT CHECK PASSED" << endl;
  }
  return !flag;
}